

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::addWarning(ConfigData *config,string *_warning)

{
  int iVar1;
  runtime_error *this;
  long *plVar2;
  long *plVar3;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = std::__cxx11::string::compare((char *)_warning);
  if (iVar1 == 0) {
    *(undefined1 *)&config->warnings = (char)config->warnings | NoAssertions;
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"Unrecognised warning: \'",_warning);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_60 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_60);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void addWarning( ConfigData& config, std::string const& _warning ) {
        if( _warning == "NoAssertions" )
            config.warnings = (WarnAbout::What)( config.warnings | WarnAbout::NoAssertions );
        else
            throw std::runtime_error( "Unrecognised warning: '" + _warning + "'" );

    }